

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::ParseFromArray
          (GpuCounterDescriptor_GpuCounterSpec *this,void *raw,size_t size)

{
  pointer pGVar1;
  pointer pGVar2;
  uint64_t uVar3;
  undefined1 uVar4;
  uint uVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t *end;
  ulong uVar12;
  uint64_t int_value;
  uint64_t preamble;
  uint32_t local_88;
  ushort local_84;
  uint8_t local_82;
  uint64_t payload_length;
  GpuCounterDescriptor_GpuCounterSpec *local_78;
  string *local_70;
  string *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  *local_58;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_50;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_48;
  bitset<11UL> *local_40;
  uint64_t payload_length_1;
  
  pGVar1 = (this->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->numerator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar1) {
    (this->numerator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar1;
  }
  pGVar1 = (this->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->denominator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar1) {
    (this->denominator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar1;
  }
  pGVar2 = (this->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->groups_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar2) {
    (this->groups_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  }
  local_48 = &this->numerator_units_;
  local_50 = &this->denominator_units_;
  local_58 = &this->groups_;
  local_60 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar11 = 0;
  local_78 = this;
  while( true ) {
    if (end <= raw) {
      uVar9 = 0;
      goto LAB_002ab679;
    }
    preamble = 0;
    if ((long)(char)*raw < 0) break;
    puVar8 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002ab531:
    uVar3 = preamble;
    uVar12 = preamble >> 3;
    uVar5 = (uint)uVar12;
    if ((uVar5 == 0) || (end <= puVar8)) goto LAB_002ab93b;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar7 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar8,(uint8_t *)end,&int_value);
      uVar10 = 0;
      uVar9 = 0;
      if (puVar7 == puVar8) goto LAB_002ab679;
      break;
    case 1:
      puVar7 = puVar8 + 1;
      if (end < puVar7) goto switchD_002ab568_caseD_3;
      int_value = *puVar8;
LAB_002ab5b4:
      uVar10 = 0;
      break;
    case 2:
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar8,(uint8_t *)end,&payload_length)
      ;
      if ((puVar6 == puVar8) || ((ulong)((long)end - (long)puVar6) < payload_length))
      goto switchD_002ab568_caseD_3;
      puVar7 = (uint64_t *)((long)puVar6 + payload_length);
      uVar10 = payload_length;
      int_value = (uint64_t)puVar6;
      break;
    default:
      goto switchD_002ab568_caseD_3;
    case 5:
      puVar7 = (uint64_t *)((long)puVar8 + 4);
      if (puVar7 <= end) {
        int_value = (uint64_t)(uint)*puVar8;
        goto LAB_002ab5b4;
      }
      goto switchD_002ab568_caseD_3;
    }
    raw = puVar7;
    if ((uVar5 < 0x10000) && (uVar10 < 0x10000000)) {
      uVar11 = uVar10 | (uVar3 & 7) << 0x30 | uVar12 << 0x20;
      uVar9 = int_value;
LAB_002ab679:
      local_40 = &local_78->_has_field_;
      local_68 = &local_78->description_;
      local_70 = &local_78->name_;
LAB_002ab69f:
      do {
        preamble = uVar9;
        local_88 = (uint32_t)uVar11;
        local_82 = (uint8_t)(uVar11 >> 0x30);
        uVar5 = (uint)(uVar11 >> 0x20);
        local_84 = (ushort)(uVar11 >> 0x20);
        if (local_84 == 0) {
          return end == (uint64_t *)raw;
        }
        if (local_84 < 0xb) {
          std::bitset<11UL>::set(local_40,(ulong)(uVar5 & 0xf),true);
          uVar5 = (uint)local_84;
        }
        uVar5 = (uVar5 & 0xffff) - 1;
        if (uVar5 < 10) {
          uVar4 = (*(code *)(&DAT_003793cc + *(int *)(&DAT_003793cc + (ulong)uVar5 * 4)))();
          return (bool)uVar4;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  ((Field *)&preamble,local_60);
        do {
          if (end <= raw) {
            uVar11 = 0;
            uVar9 = 0;
            goto LAB_002ab69f;
          }
          int_value = 0;
          if ((long)(char)*raw < 0) {
            puVar8 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
            if (puVar8 != (uint64_t *)raw) goto LAB_002ab7cd;
LAB_002ab911:
            uVar11 = 0;
            uVar9 = 0;
            goto LAB_002ab69f;
          }
          puVar8 = (uint64_t *)((long)raw + 1);
          int_value = (long)(char)*raw;
LAB_002ab7cd:
          uVar3 = int_value;
          uVar12 = int_value >> 3;
          uVar5 = (uint)uVar12;
          if ((uVar5 == 0) || (end <= puVar8)) goto LAB_002ab911;
          payload_length = 0;
          switch((uint)int_value & 7) {
          case 0:
            puVar7 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar8,(uint8_t *)end,&payload_length);
            uVar10 = 0;
            uVar11 = 0;
            uVar9 = 0;
            if (puVar7 == puVar8) goto LAB_002ab69f;
            break;
          case 1:
            puVar7 = puVar8 + 1;
            if (end < puVar7) goto switchD_002ab80d_caseD_3;
            payload_length = *puVar8;
LAB_002ab865:
            uVar10 = 0;
            break;
          case 2:
            puVar6 = (uint64_t *)
                     protozero::proto_utils::ParseVarInt
                               ((uint8_t *)puVar8,(uint8_t *)end,&payload_length_1);
            if ((puVar6 == puVar8) || ((ulong)((long)end - (long)puVar6) < payload_length_1))
            goto switchD_002ab80d_caseD_3;
            puVar7 = (uint64_t *)((long)puVar6 + payload_length_1);
            uVar10 = payload_length_1;
            payload_length = (uint64_t)puVar6;
            break;
          default:
            goto switchD_002ab80d_caseD_3;
          case 5:
            puVar7 = (uint64_t *)((long)puVar8 + 4);
            if (puVar7 <= end) {
              payload_length = (uint64_t)(uint)*puVar8;
              goto LAB_002ab865;
            }
            goto switchD_002ab80d_caseD_3;
          }
          raw = puVar7;
        } while ((0xffff < uVar5) || (0xfffffff < uVar10));
        uVar11 = uVar10 | (uVar3 & 7) << 0x30 | uVar12 << 0x20;
        uVar9 = payload_length;
      } while( true );
    }
  }
  puVar8 = (uint64_t *)protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
  if (puVar8 != (uint64_t *)raw) goto LAB_002ab531;
LAB_002ab93b:
  uVar11 = 0;
  uVar9 = 0;
  goto LAB_002ab679;
switchD_002ab568_caseD_3:
  uVar11 = 0;
  uVar9 = 0;
  goto LAB_002ab679;
switchD_002ab80d_caseD_3:
  uVar11 = 0;
  uVar9 = 0;
  goto LAB_002ab69f;
}

Assistant:

bool GpuCounterDescriptor_GpuCounterSpec::ParseFromArray(const void* raw, size_t size) {
  numerator_units_.clear();
  denominator_units_.clear();
  groups_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* counter_id */:
        field.get(&counter_id_);
        break;
      case 2 /* name */:
        field.get(&name_);
        break;
      case 3 /* description */:
        field.get(&description_);
        break;
      case 5 /* int_peak_value */:
        field.get(&int_peak_value_);
        break;
      case 6 /* double_peak_value */:
        field.get(&double_peak_value_);
        break;
      case 7 /* numerator_units */:
        numerator_units_.emplace_back();
        field.get(&numerator_units_.back());
        break;
      case 8 /* denominator_units */:
        denominator_units_.emplace_back();
        field.get(&denominator_units_.back());
        break;
      case 9 /* select_by_default */:
        field.get(&select_by_default_);
        break;
      case 10 /* groups */:
        groups_.emplace_back();
        field.get(&groups_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}